

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

int32_t llama_relative_position_bucket
                  (llama_pos x,llama_pos y,uint64_t n_buckets,bool bidirectional)

{
  undefined7 in_register_00000009;
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  
  uVar2 = x - y;
  if ((int)CONCAT71(in_register_00000009,bidirectional) == 0) {
    iVar3 = 0;
    uVar1 = -((int)uVar2 >> 0x1f & uVar2);
  }
  else {
    n_buckets = n_buckets >> 1;
    iVar3 = (int)n_buckets;
    if ((int)uVar2 < 1) {
      iVar3 = 0;
    }
    uVar1 = -uVar2;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
  }
  uVar4 = n_buckets >> 1;
  dVar7 = (double)uVar4;
  fVar5 = logf((float)((double)(int)uVar1 / dVar7));
  dVar6 = log(128.0 / dVar7);
  fVar5 = floorf((float)((double)(fVar5 * (float)(n_buckets - uVar4)) / dVar6 + dVar7));
  uVar2 = (int)n_buckets - 1;
  if ((int)fVar5 <= (int)uVar2) {
    uVar2 = (int)fVar5;
  }
  if (uVar1 < uVar4) {
    uVar2 = uVar1;
  }
  return uVar2 + iVar3;
}

Assistant:

static int32_t llama_relative_position_bucket(llama_pos x, llama_pos y, uint64_t n_buckets, bool bidirectional) {
    // TODO move to hparams if a T5 variant appears that uses a different value
    const int64_t max_distance = 128;

    if (bidirectional) {
        n_buckets >>= 1;
    }

    const int64_t max_exact = n_buckets >> 1;

    int32_t relative_position = x - y;
    int32_t relative_bucket = 0;

    if (bidirectional) {
        relative_bucket += (relative_position > 0) * n_buckets;
        relative_position = abs(relative_position);
    } else {
        relative_position = -std::min<int32_t>(relative_position, 0);
    }

    int32_t relative_position_if_large = floorf(max_exact + logf(1.0 * relative_position / max_exact) * (n_buckets - max_exact) / log(1.0 * max_distance / max_exact));
    relative_position_if_large = std::min<int32_t>(relative_position_if_large, n_buckets - 1);
    relative_bucket += (relative_position < max_exact ? relative_position : relative_position_if_large);

    return relative_bucket;
}